

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O3

int Js::NumberUtilities::CbitZeroLeft(uint32 lu)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar8 = lu << 0x10;
  if (0xffff < lu) {
    uVar8 = lu;
  }
  uVar9 = uVar8 << 8;
  if (0xffffff < uVar8) {
    uVar9 = uVar8;
  }
  uVar2 = uVar9 << 4;
  if (0xfffffff < uVar9) {
    uVar2 = uVar9;
  }
  uVar7 = uVar2 * 4;
  if (0x3fffffff < uVar2) {
    uVar7 = uVar2;
  }
  if (uVar7 < 0x40000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities.cpp"
                                ,0xbd,"(lu & 0x80000000)","lu & 0x80000000");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  iVar4 = (uint)(lu < 0x10000) * 0x10;
  iVar6 = iVar4 + 8;
  if (0xffffff < uVar8) {
    iVar6 = iVar4;
  }
  iVar4 = iVar6 + 4;
  if (0xfffffff < uVar9) {
    iVar4 = iVar6;
  }
  iVar6 = iVar4 + 2;
  if (0x3fffffff < uVar2) {
    iVar6 = iVar4;
  }
  return iVar6 - ((int)~uVar7 >> 0x1f);
}

Assistant:

int NumberUtilities::CbitZeroLeft(uint32 lu)
    {
        int cbit = 0;

        if (0 == (lu & 0xFFFF0000))
        {
            cbit += 16;
            lu <<= 16;
        }
        if (0 == (lu & 0xFF000000))
        {
            cbit += 8;
            lu <<= 8;
        }
        if (0 == (lu & 0xF0000000))
        {
            cbit += 4;
            lu <<= 4;
        }
        if (0 == (lu & 0xC0000000))
        {
            cbit += 2;
            lu <<= 2;
        }
        if (0 == (lu & 0x80000000))
        {
            cbit += 1;
            lu <<= 1;
        }
        Assert(lu & 0x80000000);

        return cbit;
    }